

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.hpp
# Opt level: O2

ChunkVectorInfo * __thiscall duckdb::ChunkInfo::Cast<duckdb::ChunkVectorInfo>(ChunkInfo *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == VECTOR_INFO) {
    return (ChunkVectorInfo *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast chunk info to type - query result type mismatch",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast chunk info to type - query result type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}